

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnAssertUnlinkableCommand
          (CommandRunner *this,AssertUnlinkableCommand *command)

{
  bool bVar1;
  Ref store;
  pointer pcVar2;
  char *format;
  Enum EVar3;
  uint32_t uVar4;
  Ptr *in_R9;
  string_view module_filename;
  Ptr module;
  Ptr trap;
  RefVec imports;
  Errors errors;
  Ptr instance;
  undefined8 local_50 [4];
  
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  module_filename._M_str = (command->filename)._M_dataplus._M_p;
  module_filename._M_len = (command->filename)._M_string_length;
  ReadModule(&module,this,module_filename,&errors);
  if (module.obj_ == (Module *)0x0) {
    uVar4 = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
    pcVar2 = (command->filename)._M_dataplus._M_p;
    format = "unable to compile unlinkable module: \"%s\"";
  }
  else {
    bVar1 = ValidIR(&command->filename);
    if (bVar1) {
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PopulateImports(this,&module,&imports);
      trap.obj_ = (Trap *)0x0;
      trap.store_ = (Store *)0x0;
      trap.root_index_ = 0;
      store = wabt::interp::RefPtr<wabt::interp::Module>::ref(&module);
      wabt::interp::Instance::Instantiate
                (&instance,(Instance *)this,(Store *)store.index,(Ref)&imports,(RefVec *)&trap,in_R9
                );
      uVar4 = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
      bVar1 = trap.obj_ == (Trap *)0x0;
      if (bVar1) {
        PrintError(this,uVar4,"expected module to be unlinkable: \"%s\"",
                   (command->filename)._M_dataplus._M_p);
      }
      else {
        std::__cxx11::string::string((string *)local_50,(string *)&(trap.obj_)->message_);
        PrintError(this,uVar4,"assert_unlinkable passed:\n  error: %s",local_50[0]);
        std::__cxx11::string::_M_dispose();
      }
      EVar3 = (Enum)bVar1;
      wabt::interp::RefPtr<wabt::interp::Instance>::reset(&instance);
      wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
      std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
                (&imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)
      ;
      goto LAB_0011d8f4;
    }
    uVar4 = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
    pcVar2 = (command->filename)._M_dataplus._M_p;
    format = "IR Validator thinks module is invalid: \"%s\"";
  }
  PrintError(this,uVar4,format,pcVar2);
  EVar3 = Error;
LAB_0011d8f4:
  wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  return (Result)EVar3;
}

Assistant:

wabt::Result CommandRunner::OnAssertUnlinkableCommand(
    const AssertUnlinkableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile unlinkable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  if (!ValidIR(command->filename)) {
    PrintError(command->line, "IR Validator thinks module is invalid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be unlinkable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: Change to one-line error.
  PrintError(command->line, "assert_unlinkable passed:\n  error: %s",
             trap->message().c_str());
  return wabt::Result::Ok;
}